

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-objdump.cc
# Opt level: O2

int ProgramMain(int argc,char **argv)

{
  pointer ppcVar1;
  pointer ppcVar2;
  Result RVar3;
  pointer ppcVar4;
  uint uVar5;
  allocator<char> local_f9;
  _Any_data local_f8;
  code *local_e8;
  code *local_e0;
  OptionParser parser;
  _Any_data local_48;
  code *local_38;
  code *local_30;
  
  wabt::InitStdio();
  wabt::OptionParser::OptionParser
            (&parser,"wasm-objdump",
             "  Print information about the contents of wasm binaries.\n\nexamples:\n  $ wasm-objdump test.wasm\n"
            );
  local_f8._M_unused._M_object = (void *)0x0;
  local_f8._8_8_ = 0;
  local_e0 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm-objdump.cc:46:20)>
             ::_M_invoke;
  local_e8 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm-objdump.cc:46:20)>
             ::_M_manager;
  wabt::OptionParser::AddOption(&parser,'h',"headers","Print headers",(NullCallback *)&local_f8);
  if (local_e8 != (code *)0x0) {
    (*local_e8)(&local_f8,&local_f8,3);
  }
  local_f8._M_unused._M_object = (void *)0x0;
  local_f8._8_8_ = 0;
  local_e0 = std::
             _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm-objdump.cc:49:7)>
             ::_M_invoke;
  local_e8 = std::
             _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm-objdump.cc:49:7)>
             ::_M_manager;
  wabt::OptionParser::AddOption
            (&parser,'j',"section","SECTION","Select just one section",(Callback *)&local_f8);
  if (local_e8 != (code *)0x0) {
    (*local_e8)(&local_f8,&local_f8,3);
  }
  local_f8._M_unused._M_object = (void *)0x0;
  local_f8._8_8_ = 0;
  local_e0 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm-objdump.cc:51:20)>
             ::_M_invoke;
  local_e8 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm-objdump.cc:51:20)>
             ::_M_manager;
  wabt::OptionParser::AddOption
            (&parser,'s',"full-contents","Print raw section contents",(NullCallback *)&local_f8);
  if (local_e8 != (code *)0x0) {
    (*local_e8)(&local_f8,&local_f8,3);
  }
  local_f8._M_unused._M_object = (void *)0x0;
  local_f8._8_8_ = 0;
  local_e0 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm-objdump.cc:53:20)>
             ::_M_invoke;
  local_e8 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm-objdump.cc:53:20)>
             ::_M_manager;
  wabt::OptionParser::AddOption
            (&parser,'d',"disassemble","Disassemble function bodies",(NullCallback *)&local_f8);
  if (local_e8 != (code *)0x0) {
    (*local_e8)(&local_f8,&local_f8,3);
  }
  local_f8._M_unused._M_object = (void *)0x0;
  local_f8._8_8_ = 0;
  local_e0 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm-objdump.cc:54:62)>
             ::_M_invoke;
  local_e8 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm-objdump.cc:54:62)>
             ::_M_manager;
  wabt::OptionParser::AddOption
            (&parser,"debug","Print extra debug information",(NullCallback *)&local_f8);
  if (local_e8 != (code *)0x0) {
    (*local_e8)(&local_f8,&local_f8,3);
  }
  local_f8._M_unused._M_object = (void *)0x0;
  local_f8._8_8_ = 0;
  local_e0 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm-objdump.cc:60:20)>
             ::_M_invoke;
  local_e8 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm-objdump.cc:60:20)>
             ::_M_manager;
  wabt::OptionParser::AddOption
            (&parser,'x',"details","Show section details",(NullCallback *)&local_f8);
  if (local_e8 != (code *)0x0) {
    (*local_e8)(&local_f8,&local_f8,3);
  }
  local_f8._M_unused._M_object = (void *)0x0;
  local_f8._8_8_ = 0;
  local_e0 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm-objdump.cc:62:20)>
             ::_M_invoke;
  local_e8 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm-objdump.cc:62:20)>
             ::_M_manager;
  wabt::OptionParser::AddOption
            (&parser,'r',"reloc","Show relocations inline with disassembly",
             (NullCallback *)&local_f8);
  if (local_e8 != (code *)0x0) {
    (*local_e8)(&local_f8,&local_f8,3);
  }
  local_f8._M_unused._M_object = (void *)0x0;
  local_f8._8_8_ = 0;
  local_e0 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm-objdump.cc:66:20)>
             ::_M_invoke;
  local_e8 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm-objdump.cc:66:20)>
             ::_M_manager;
  wabt::OptionParser::AddOption
            (&parser,'\0',"section-offsets",
             "Print section offsets instead of file offsets in code disassembly",
             (NullCallback *)&local_f8);
  if (local_e8 != (code *)0x0) {
    (*local_e8)(&local_f8,&local_f8,3);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_f8._M_pod_data,"filename",&local_f9);
  local_48._M_unused._M_object = (void *)0x0;
  local_48._8_8_ = 0;
  local_30 = std::
             _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm-objdump.cc:69:7)>
             ::_M_invoke;
  local_38 = std::
             _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm-objdump.cc:69:7)>
             ::_M_manager;
  uVar5 = 1;
  wabt::OptionParser::AddArgument(&parser,(string *)&local_f8,OneOrMore,(Callback *)&local_48);
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,__destroy_functor);
  }
  std::__cxx11::string::_M_dispose();
  wabt::OptionParser::Parse(&parser,argc,argv);
  wabt::OptionParser::~OptionParser(&parser);
  ppcVar1 = s_infiles.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  ppcVar2 = s_infiles.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((((s_objdump_options.headers == false) && (s_objdump_options.details == false)) &&
      (s_objdump_options.disassemble == false)) && (s_objdump_options.raw == false)) {
    fwrite("At least one of the following switches must be given:\n",0x36,1,_stderr);
    fwrite(" -d/--disassemble\n",0x12,1,_stderr);
    fwrite(" -h/--headers\n",0xe,1,_stderr);
    fwrite(" -x/--details\n",0xe,1,_stderr);
    fwrite(" -s/--full-contents\n",0x14,1,_stderr);
  }
  else {
    do {
      ppcVar4 = ppcVar2;
      if (ppcVar4 == ppcVar1) break;
      RVar3 = dump_file(*ppcVar4);
      ppcVar2 = ppcVar4 + 1;
    } while (RVar3.enum_ != Error);
    uVar5 = (uint)(ppcVar4 != ppcVar1);
  }
  return uVar5;
}

Assistant:

int ProgramMain(int argc, char** argv) {
  InitStdio();

  ParseOptions(argc, argv);
  if (!s_objdump_options.headers && !s_objdump_options.details &&
      !s_objdump_options.disassemble && !s_objdump_options.raw) {
    fprintf(stderr, "At least one of the following switches must be given:\n");
    fprintf(stderr, " -d/--disassemble\n");
    fprintf(stderr, " -h/--headers\n");
    fprintf(stderr, " -x/--details\n");
    fprintf(stderr, " -s/--full-contents\n");
    return 1;
  }

  for (const char* filename : s_infiles) {
    if (Failed(dump_file(filename))) {
      return 1;
    }
  }

  return 0;
}